

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O1

void __thiscall clunk::Node::OutputPV(Node *this,int score,int bound)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  char *pcVar5;
  Move *this_00;
  Output out;
  timeval tv;
  Output local_58;
  string local_50;
  
  if (0 < this->pvCount) {
    gettimeofday((timeval *)&local_50,(__timezone_ptr_t)0x0);
    senjo::Output::Output(&local_58,NoPrefix);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"info depth ",0xb);
    std::ostream::operator<<((ostream *)&std::cout,_depth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," seldepth ",10);
    std::ostream::operator<<((ostream *)&std::cout,_seldepth);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nodes ",7);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," time ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," nps ",5);
    std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    if (bound != 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout," currmovenumber ",0x10);
      std::ostream::operator<<((ostream *)&std::cout,_movenum);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," currmove ",10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,_currmove_abi_cxx11_,DAT_0017fa78);
    }
    uVar3 = -score;
    if (0 < score) {
      uVar3 = score;
    }
    if (uVar3 < 31000) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," score cp ",10);
      std::ostream::operator<<((ostream *)&std::cout,score);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," score mate ",0xc);
      iVar2 = (int)(0x7d01 - uVar3) / 2;
      iVar1 = -iVar2;
      if (-1 < score) {
        iVar1 = iVar2;
      }
      std::ostream::operator<<((ostream *)&std::cout,iVar1);
    }
    if (bound == 0) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," pv",3);
      if (0 < this->pvCount) {
        this_00 = this->pv;
        lVar4 = 0;
        do {
          local_50._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)&local_50,1);
          Move::ToString_abi_cxx11_(&local_50,this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     (char *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                      local_50._M_dataplus._M_p._0_1_),local_50._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_) !=
              &local_50.field_2) {
            operator_delete((undefined1 *)
                            CONCAT71(local_50._M_dataplus._M_p._1_7_,local_50._M_dataplus._M_p._0_1_
                                    ));
          }
          lVar4 = lVar4 + 1;
          this_00 = this_00 + 1;
        } while (lVar4 < this->pvCount);
      }
    }
    else {
      pcVar5 = " lowerbound";
      if (bound < 0) {
        pcVar5 = " upperbound";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar5,0xb);
    }
    senjo::Output::~Output(&local_58);
  }
  return;
}

Assistant:

void OutputPV(const int score, const int bound = 0) const {
    if (pvCount > 0) {
      const uint64_t msecs = (senjo::Now() - _startTime);
      senjo::Output out(senjo::Output::NoPrefix);

      const uint64_t nodes = (_stats.snodes + _stats.qnodes);
      out << "info depth " << _depth
          << " seldepth " << _seldepth
          << " nodes " << nodes
          << " time " << msecs
          << " nps " << static_cast<uint64_t>(senjo::Rate(nodes, msecs));

      if (bound) {
        out << " currmovenumber " << _movenum
            << " currmove " << _currmove;
      }

      if (abs(score) < MateScore) {
        out << " score cp " << score;
      }
      else {
        const int count = (Infinity - abs(score));
        const int mate = ((count + 1) / 2);
        out << " score mate " << ((score < 0) ? -mate : mate);
      }

      if (bound) {
        out << ((bound < 0) ? " upperbound" : " lowerbound");
      }
      else {
        out << " pv";
        for (int i = 0; i < pvCount; ++i) {
          const Move& move = pv[i];
          out << ' ' << move.ToString();
        }
      }
    }
  }